

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

bool __thiscall wallet::CWallet::ShouldResend(CWallet *this)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  Chain *pCVar4;
  time_point tVar5;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->fBroadcastTransactions == true) {
    pCVar4 = chain(this);
    iVar3 = (*pCVar4->_vptr_Chain[0x22])(pCVar4);
    if ((char)iVar3 != '\0') {
      tVar5 = NodeClock::now();
      bVar2 = (this->m_next_resend).__d.__r <= (long)tVar5.__d.__r;
      goto LAB_009a681f;
    }
  }
  bVar2 = false;
LAB_009a681f:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool CWallet::ShouldResend() const
{
    // Don't attempt to resubmit if the wallet is configured to not broadcast
    if (!fBroadcastTransactions) return false;

    // During reindex, importing and IBD, old wallet transactions become
    // unconfirmed. Don't resend them as that would spam other nodes.
    // We only allow forcing mempool submission when not relaying to avoid this spam.
    if (!chain().isReadyToBroadcast()) return false;

    // Do this infrequently and randomly to avoid giving away
    // that these are our transactions.
    if (NodeClock::now() < m_next_resend) return false;

    return true;
}